

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O1

wchar_t tty_quotemode(EditLine *el)

{
  termios *tios;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  speed_t sVar4;
  speed_t sVar5;
  cc_t cVar6;
  cc_t cVar7;
  cc_t cVar8;
  cc_t cVar9;
  cc_t cVar10;
  cc_t cVar11;
  cc_t cVar12;
  cc_t cVar13;
  tcflag_t tVar14;
  tcflag_t tVar15;
  tcflag_t tVar16;
  tcflag_t tVar17;
  wchar_t wVar18;
  
  wVar18 = L'\0';
  if ((el->el_tty).t_mode != '\x02') {
    tios = &(el->el_tty).t_ts;
    tVar14 = (el->el_tty).t_ed.c_iflag;
    tVar15 = (el->el_tty).t_ed.c_oflag;
    tVar16 = (el->el_tty).t_ed.c_cflag;
    tVar17 = (el->el_tty).t_ed.c_lflag;
    cVar6 = (el->el_tty).t_ed.c_line;
    cVar7 = (el->el_tty).t_ed.c_cc[0];
    cVar8 = (el->el_tty).t_ed.c_cc[1];
    cVar9 = (el->el_tty).t_ed.c_cc[2];
    cVar10 = (el->el_tty).t_ed.c_cc[3];
    cVar11 = (el->el_tty).t_ed.c_cc[4];
    cVar12 = (el->el_tty).t_ed.c_cc[5];
    cVar13 = (el->el_tty).t_ed.c_cc[6];
    uVar1 = *(undefined8 *)((el->el_tty).t_ed.c_cc + 7);
    uVar2 = *(undefined8 *)((el->el_tty).t_ed.c_cc + 0xf);
    uVar3 = *(undefined8 *)((el->el_tty).t_ed.c_cc + 0x17);
    sVar4 = (el->el_tty).t_ed.c_ispeed;
    sVar5 = (el->el_tty).t_ed.c_ospeed;
    *(undefined8 *)((el->el_tty).t_ts.c_cc + 0x1b) = *(undefined8 *)((el->el_tty).t_ed.c_cc + 0x1b);
    (el->el_tty).t_ts.c_ispeed = sVar4;
    (el->el_tty).t_ts.c_ospeed = sVar5;
    *(undefined8 *)((el->el_tty).t_ts.c_cc + 0xf) = uVar2;
    *(undefined8 *)((el->el_tty).t_ts.c_cc + 0x17) = uVar3;
    (el->el_tty).t_ts.c_line = cVar6;
    (el->el_tty).t_ts.c_cc[0] = cVar7;
    (el->el_tty).t_ts.c_cc[1] = cVar8;
    (el->el_tty).t_ts.c_cc[2] = cVar9;
    (el->el_tty).t_ts.c_cc[3] = cVar10;
    (el->el_tty).t_ts.c_cc[4] = cVar11;
    (el->el_tty).t_ts.c_cc[5] = cVar12;
    (el->el_tty).t_ts.c_cc[6] = cVar13;
    *(undefined8 *)((el->el_tty).t_ts.c_cc + 7) = uVar1;
    (el->el_tty).t_ts.c_iflag = tVar14;
    (el->el_tty).t_ts.c_oflag = tVar15;
    (el->el_tty).t_ts.c_cflag = tVar16;
    (el->el_tty).t_ts.c_lflag = tVar17;
    tty_setup_flags(el,tios,L'\x02');
    wVar18 = tty_setty(el,L'\x01',tios);
    if (wVar18 == L'\xffffffff') {
      wVar18 = L'\xffffffff';
    }
    else {
      (el->el_tty).t_mode = '\x02';
      wVar18 = L'\0';
    }
  }
  return wVar18;
}

Assistant:

libedit_private int
tty_quotemode(EditLine *el)
{
	if (el->el_tty.t_mode == QU_IO)
		return 0;

	el->el_tty.t_qu = el->el_tty.t_ed;

	tty_setup_flags(el, &el->el_tty.t_qu, QU_IO);

	if (tty_setty(el, TCSADRAIN, &el->el_tty.t_qu) == -1) {
#ifdef DEBUG_TTY
		(void) fprintf(el->el_errfile, "%s: tty_setty: %s\n", __func__,
		    strerror(errno));
#endif /* DEBUG_TTY */
		return -1;
	}
	el->el_tty.t_mode = QU_IO;
	return 0;
}